

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O3

void __thiscall Uniforms::printAvailableUniforms(Uniforms *this,bool _non_active)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  undefined7 in_register_00000031;
  iterator it;
  char local_50;
  undefined7 uStack_4f;
  long local_48;
  long local_40 [2];
  
  p_Var2 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->functions)._M_t._M_impl.super__Rb_tree_header;
  if ((int)CONCAT71(in_register_00000031,_non_active) == 0) {
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      do {
        if ((char)p_Var2[5]._M_color == _S_black) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"uniform ",8);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,*(char **)(p_Var2 + 4),(long)p_Var2[4]._M_parent
                             );
          local_50 = ' ';
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_50,1);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar1,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
          if (p_Var2[3]._M_left != (_Base_ptr)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," // ",4);
            if (p_Var2[3]._M_left == (_Base_ptr)0x0) goto LAB_001dacff;
            (*(code *)p_Var2[3]._M_right)(&local_50,p_Var2 + 3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)CONCAT71(uStack_4f,local_50),local_48);
            if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
              operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
            }
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  else if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"uniform ",8);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var2 + 4),(long)p_Var2[4]._M_parent);
      local_50 = ' ';
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_50,1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
      if (p_Var2[3]._M_left != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," // ",4);
        if (p_Var2[3]._M_left == (_Base_ptr)0x0) {
LAB_001dacff:
          std::__throw_bad_function_call();
        }
        (*(code *)p_Var2[3]._M_right)(&local_50,p_Var2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)CONCAT71(uStack_4f,local_50),local_48);
        if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
          operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void Uniforms::printAvailableUniforms(bool _non_active) {
    if (_non_active) {
        // Print all Native Uniforms (they carry functions)
        for (UniformFunctionsMap::iterator it= functions.begin(); it != functions.end(); ++it) {                
            std::cout << "uniform " << it->second.type << ' ' << it->first << ";";
            if (it->second.print) 
                std::cout << " // " << it->second.print();
            std::cout << std::endl;
        }
    }
    else {
        // Print Native Uniforms (they carry functions) that are present on the shader
        for (UniformFunctionsMap::iterator it= functions.begin(); it != functions.end(); ++it) {                
            if (it->second.present) {
                std::cout<< "uniform " << it->second.type << ' ' << it->first << ";";
                if (it->second.print)
                    std::cout << " // " << it->second.print();
                std::cout << std::endl;
            }
        }
    }
}